

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

void Fra_PrintClass(Fra_Cla_t *p,Aig_Obj_t **pClass)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  int local_24;
  int i;
  Aig_Obj_t *pTemp;
  Aig_Obj_t **pClass_local;
  Fra_Cla_t *p_local;
  
  local_24 = 1;
  while( true ) {
    if (pClass[local_24] == (Aig_Obj_t *)0x0) {
      printf("{ ");
      local_24 = 0;
      while( true ) {
        pAVar4 = pClass[local_24];
        if (pAVar4 == (Aig_Obj_t *)0x0) break;
        uVar1 = pAVar4->Id;
        uVar2 = *(undefined8 *)&pAVar4->field_0x18;
        uVar3 = Aig_SupportSize(p->pAig,pAVar4);
        printf("%d(%d,%d) ",(ulong)uVar1,(ulong)((uint)((ulong)uVar2 >> 0x20) & 0xffffff),
               (ulong)uVar3);
        local_24 = local_24 + 1;
      }
      printf("}\n");
      return;
    }
    pAVar4 = Fra_ClassObjRepr(pClass[local_24]);
    if (pAVar4 != *pClass) break;
    local_24 = local_24 + 1;
  }
  __assert_fail("Fra_ClassObjRepr(pTemp) == pClass[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                ,0xda,"void Fra_PrintClass(Fra_Cla_t *, Aig_Obj_t **)");
}

Assistant:

void Fra_PrintClass( Fra_Cla_t * p, Aig_Obj_t ** pClass )
{
    Aig_Obj_t * pTemp;
    int i;
    for ( i = 1; (pTemp = pClass[i]); i++ )
        assert( Fra_ClassObjRepr(pTemp) == pClass[0] );
    printf( "{ " );
    for ( i = 0; (pTemp = pClass[i]); i++ )
        printf( "%d(%d,%d) ", pTemp->Id, pTemp->Level, Aig_SupportSize(p->pAig,pTemp) );
    printf( "}\n" );
}